

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleObjectRefNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  uint *puVar3;
  _Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false> _Var4;
  DeadlyImportError *this_00;
  ulong uVar5;
  unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objRefNames;
  
  if (this->m_currentNode != (aiNode *)0x0) {
    objRefNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    objRefNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    objRefNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getRefNames(node,&objRefNames);
    pbVar2 = objRefNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar1 = objRefNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (this->m_tokenType == 5) {
      uVar5 = (long)objRefNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)objRefNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      this->m_currentNode->mNumMeshes = (uint)uVar5;
      puVar3 = (uint *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) |
                                      (long)objRefNames.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)objRefNames.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3);
      this->m_currentNode->mMeshes = puVar3;
      if (pbVar1 != pbVar2) {
        _Var4._M_head_impl = (RefInfo *)operator_new(0x28);
        (_Var4._M_head_impl)->m_node = this->m_currentNode;
        (_Var4._M_head_impl)->m_type = MeshRef;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&(_Var4._M_head_impl)->m_Names,&objRefNames);
        local_50._M_t.
        super___uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
        .super__Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false>._M_head_impl =
             (__uniq_ptr_data<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>,_true,_true>
              )(__uniq_ptr_data<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>,_true,_true>
                )_Var4._M_head_impl;
        std::
        vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>,std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>>
        ::
        emplace_back<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>
                  ((vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>,std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>>
                    *)&this->m_unresolvedRefStack,&local_50);
        std::
        unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
        ::~unique_ptr(&local_50);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&objRefNames);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&objRefNames,"No parent node for name.",(allocator<char> *)&local_50);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&objRefNames);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OpenGEXImporter::handleObjectRefNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    std::vector<std::string> objRefNames;
    getRefNames( node, objRefNames );

    // when we are dealing with a geometry node prepare the mesh cache
    if ( m_tokenType == Grammar::GeometryNodeToken ) {
        m_currentNode->mNumMeshes = static_cast<unsigned int>(objRefNames.size());
        m_currentNode->mMeshes = new unsigned int[ objRefNames.size() ];
        if ( !objRefNames.empty() ) {
            m_unresolvedRefStack.push_back( std::unique_ptr<RefInfo>( new RefInfo( m_currentNode, RefInfo::MeshRef, objRefNames ) ) );
        }
    } else if ( m_tokenType == Grammar::LightNodeToken ) {
        // TODO!
    } else if ( m_tokenType == Grammar::CameraNodeToken ) {
        // TODO!
    }
}